

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.hpp
# Opt level: O3

size_t __thiscall
mahi::util::detail::
ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_>::add_cb
          (ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_> *this,
          CbFunction *cb)

{
  size_t *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _List_node_base *p_Var3;
  undefined1 local_19;
  function<void_(int,_int,_int,_int)> *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_18 = (function<void_(int,_int,_int,_int)> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::function<void(int,int,int,int)>,std::allocator<std::function<void(int,int,int,int)>>,std::function<void(int,int,int,int)>const&>
            (&_Stack_10,&local_18,(allocator<std::function<void_(int,_int,_int,_int)>_> *)&local_19,
             cb);
  p_Var3 = (_List_node_base *)operator_new(0x20);
  _Var2._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3[1]._M_next = (_List_node_base *)local_18;
  p_Var3[1]._M_prev = (_List_node_base *)_Var2._M_pi;
  local_18 = (function<void_(int,_int,_int,_int)> *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->callback_list_).
            super__List_base<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>,_std::allocator<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (_Stack_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_10._M_pi);
  }
  return (size_t)(this->callback_list_).
                 super__List_base<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>,_std::allocator<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

size_t add_cb(const CbFunction &cb)
    {
        callback_list_.emplace_back(std::make_shared<CbFunction>(cb));
        return size_t(callback_list_.back().get());
    }